

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_data_converter_process_pcm_frames
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_format mVar1;
  ma_resampling_backend_vtable *pmVar2;
  _func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *p_Var3;
  ma_uint64 *pmVar4;
  ma_result mVar5;
  ulong uVar6;
  _func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
  *UNRECOVERED_JUMPTABLE;
  ulong uVar7;
  void *pvVar8;
  size_t __n;
  undefined1 *puVar9;
  ulong *puVar10;
  undefined1 *pFramesOut_00;
  ma_resampling_backend *pmVar11;
  ulong uVar12;
  ulong uVar13;
  ma_bool8 mVar14;
  ma_channel_converter *pmVar15;
  undefined1 *puVar16;
  ulong *puVar17;
  ma_uint64 mVar18;
  ma_uint64 mVar19;
  bool bVar20;
  ma_uint8 pTempBufferMid [4096];
  ma_uint8 pTempBufferOut [4096];
  ma_uint8 pTempBufferIn [4096];
  ulong local_30a0;
  ma_uint64 local_3098;
  ma_channel_converter *local_3090;
  ma_uint64 *local_3088;
  ma_uint64 local_3080;
  ma_uint64 *local_3078;
  void *local_3070;
  void *local_3068;
  ma_uint64 local_3060;
  ma_channel_converter *local_3058;
  ma_channel_converter *local_3050;
  ma_uint64 local_3048;
  ulong local_3040;
  undefined1 local_3038 [4096];
  ulong local_2038 [512];
  undefined1 local_1038 [4104];
  
  mVar5 = MA_INVALID_ARGS;
  if (pConverter == (ma_data_converter *)0x0) {
    return MA_INVALID_ARGS;
  }
  local_3088 = pFrameCountIn;
  local_3078 = pFrameCountOut;
  local_3070 = pFramesOut;
  local_3068 = pFramesIn;
  switch(pConverter->executionPath) {
  case ma_data_converter_execution_path_passthrough:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = *pFrameCountOut;
    }
    if (uVar12 < uVar13) {
      uVar13 = uVar12;
    }
    if (pFramesOut != (void *)0x0) {
      __n = (*(int *)(&DAT_0019a900 + (ulong)pConverter->formatOut * 4) * pConverter->channelsOut) *
            uVar13;
      if (pFramesIn == (void *)0x0) {
LAB_001642ac:
        if (__n != 0) {
          memset(pFramesOut,0,__n);
        }
      }
      else {
        memcpy(pFramesOut,pFramesIn,__n);
      }
    }
    goto LAB_001642bb;
  case ma_data_converter_execution_path_format_only:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = *pFrameCountOut;
    }
    if (uVar12 < uVar13) {
      uVar13 = uVar12;
    }
    if (pFramesOut != (void *)0x0) {
      if (pFramesIn == (void *)0x0) {
        __n = (*(int *)(&DAT_0019a900 + (ulong)pConverter->formatOut * 4) * pConverter->channelsOut)
              * uVar13;
        goto LAB_001642ac;
      }
      ma_pcm_convert(pFramesOut,pConverter->formatOut,pFramesIn,pConverter->formatIn,
                     pConverter->channelsIn * uVar13,pConverter->ditherMode);
    }
LAB_001642bb:
    if (local_3088 != (ulong *)0x0) {
      *local_3088 = uVar13;
    }
    mVar5 = MA_SUCCESS;
    if (pFrameCountOut != (ma_uint64 *)0x0) {
      *pFrameCountOut = uVar13;
    }
    break;
  case ma_data_converter_execution_path_channels_only:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      local_3098 = 0;
    }
    else {
      local_3098 = *pFrameCountOut;
    }
    if (uVar12 < local_3098) {
      local_3098 = uVar12;
    }
    if ((pConverter->hasPreFormatConversion == '\0') &&
       (pConverter->hasPostFormatConversion == '\0')) {
      mVar5 = ma_channel_converter_process_pcm_frames
                        (&pConverter->channelConverter,pFramesOut,pFramesIn,local_3098);
      if (mVar5 != MA_SUCCESS) {
        return mVar5;
      }
    }
    else if (local_3098 != 0) {
      local_3090 = &pConverter->channelConverter;
      uVar12 = 0;
      do {
        mVar1 = (pConverter->channelConverter).format;
        uVar13 = 0x1000 / (ulong)((pConverter->channelConverter).channelsOut *
                                 *(int *)(&DAT_0019a900 + (ulong)mVar1 * 4));
        if (local_3068 == (void *)0x0) {
          puVar16 = (undefined1 *)0x0;
        }
        else {
          puVar16 = (undefined1 *)
                    ((*(int *)(&DAT_0019a900 + (ulong)pConverter->formatIn * 4) *
                     pConverter->channelsIn) * uVar12 + (long)local_3068);
        }
        if (local_3070 == (void *)0x0) {
          puVar9 = (undefined1 *)0x0;
        }
        else {
          puVar9 = (undefined1 *)
                   ((*(int *)(&DAT_0019a900 + (ulong)pConverter->formatOut * 4) *
                    pConverter->channelsOut) * uVar12 + (long)local_3070);
        }
        if (pConverter->hasPreFormatConversion == '\0') {
          if (local_3098 - uVar12 < uVar13) {
            uVar13 = local_3098 - uVar12;
          }
          pFramesOut_00 = local_1038;
        }
        else {
          uVar6 = 0x1000 / (ulong)(*(int *)(&DAT_0019a900 + (ulong)mVar1 * 4) *
                                  (pConverter->channelConverter).channelsIn);
          uVar7 = local_3098 - uVar12;
          if (uVar6 <= local_3098 - uVar12) {
            uVar7 = uVar6;
          }
          mVar14 = pConverter->hasPostFormatConversion;
          if (uVar7 < uVar13) {
            uVar13 = uVar7;
          }
          if (mVar14 == '\0') {
            uVar13 = uVar7;
          }
          if (puVar16 == (undefined1 *)0x0) {
            memset(local_3038,0,0x1000);
          }
          else {
            ma_pcm_convert(local_3038,mVar1,puVar16,pConverter->formatIn,
                           pConverter->channelsIn * uVar13,pConverter->ditherMode);
            mVar14 = pConverter->hasPostFormatConversion;
          }
          pFramesOut_00 = puVar9;
          if (mVar14 != '\0') {
            pFramesOut_00 = local_1038;
          }
          puVar16 = local_3038;
        }
        mVar5 = ma_channel_converter_process_pcm_frames(local_3090,pFramesOut_00,puVar16,uVar13);
        if (mVar5 != MA_SUCCESS) break;
        if ((pConverter->hasPostFormatConversion != '\0') && (puVar9 != (undefined1 *)0x0)) {
          ma_pcm_convert(puVar9,pConverter->formatOut,local_1038,
                         (pConverter->channelConverter).format,
                         (pConverter->channelConverter).channelsOut * uVar13,pConverter->ditherMode)
          ;
        }
        uVar12 = uVar12 + uVar13;
      } while (uVar12 < local_3098);
    }
    if (local_3088 != (ma_uint64 *)0x0) {
      *local_3088 = local_3098;
    }
    mVar5 = MA_SUCCESS;
    if (local_3078 != (ma_uint64 *)0x0) {
      *local_3078 = local_3098;
    }
    break;
  case ma_data_converter_execution_path_resample_only:
    if ((pConverter->hasPreFormatConversion == '\0') &&
       (pConverter->hasPostFormatConversion == '\0')) {
      if (pFrameCountIn != (ma_uint64 *)0x0 || pFrameCountOut != (ma_uint64 *)0x0) {
        pmVar2 = (pConverter->resampler).pBackendVTable;
        mVar5 = MA_NOT_IMPLEMENTED;
        if ((pmVar2 != (ma_resampling_backend_vtable *)0x0) &&
           (UNRECOVERED_JUMPTABLE = pmVar2->onProcess,
           UNRECOVERED_JUMPTABLE !=
           (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
            *)0x0)) {
          mVar5 = (*UNRECOVERED_JUMPTABLE)
                            ((pConverter->resampler).pBackendUserData,
                             (pConverter->resampler).pBackend,pFramesIn,pFrameCountIn,pFramesOut,
                             pFrameCountOut);
          return mVar5;
        }
      }
    }
    else {
      mVar5 = MA_SUCCESS;
      if (pFrameCountIn == (ma_uint64 *)0x0) {
        local_3090 = (ma_channel_converter *)0x0;
      }
      else {
        local_3090 = (ma_channel_converter *)*pFrameCountIn;
      }
      if (pFrameCountOut == (ma_uint64 *)0x0) {
        mVar18 = 0;
        mVar19 = 0;
      }
      else {
        local_3098 = *pFrameCountOut;
        if (local_3098 == 0) {
          mVar18 = 0;
          mVar19 = 0;
          pmVar4 = pFrameCountIn;
        }
        else {
          mVar19 = 0;
          mVar18 = 0;
          do {
            mVar1 = (pConverter->resampler).format;
            uVar12 = 0x1000 / (ulong)(*(int *)(&DAT_0019a900 + (ulong)mVar1 * 4) *
                                     (pConverter->resampler).channels);
            if (local_3068 == (void *)0x0) {
              pvVar8 = (void *)0x0;
            }
            else {
              pvVar8 = (void *)((*(int *)(&DAT_0019a900 + (ulong)pConverter->formatIn * 4) *
                                pConverter->channelsIn) * mVar18 + (long)local_3068);
            }
            if (local_3070 == (void *)0x0) {
              puVar16 = (undefined1 *)0x0;
            }
            else {
              puVar16 = (undefined1 *)
                        ((*(int *)(&DAT_0019a900 + (ulong)pConverter->formatOut * 4) *
                         pConverter->channelsOut) * mVar19 + (long)local_3070);
            }
            if (pConverter->hasPreFormatConversion == '\0') {
              local_2038[0] = (long)local_3090 - mVar18;
              local_30a0 = local_3098 - mVar19;
              if (uVar12 <= local_3098 - mVar19) {
                local_30a0 = uVar12;
              }
              pmVar2 = (pConverter->resampler).pBackendVTable;
              if ((pmVar2 == (ma_resampling_backend_vtable *)0x0) ||
                 (UNRECOVERED_JUMPTABLE = pmVar2->onProcess,
                 UNRECOVERED_JUMPTABLE ==
                 (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
                  *)0x0)) goto LAB_00164351;
              mVar5 = (*UNRECOVERED_JUMPTABLE)
                                ((pConverter->resampler).pBackendUserData,
                                 (pConverter->resampler).pBackend,pvVar8,local_2038,local_1038,
                                 &local_30a0);
              pmVar4 = local_3088;
            }
            else {
              local_2038[0] = (long)local_3090 - mVar18;
              if (uVar12 <= (long)local_3090 - mVar18) {
                local_2038[0] = uVar12;
              }
              if (pvVar8 == (void *)0x0) {
                memset(local_3038,0,0x1000);
              }
              else {
                ma_pcm_convert(local_3038,mVar1,pvVar8,pConverter->formatIn,
                               local_2038[0] * pConverter->channelsIn,pConverter->ditherMode);
              }
              local_30a0 = local_3098 - mVar19;
              if (pConverter->hasPostFormatConversion == '\0') {
                pmVar2 = (pConverter->resampler).pBackendVTable;
                if ((pmVar2 == (ma_resampling_backend_vtable *)0x0) ||
                   (UNRECOVERED_JUMPTABLE = pmVar2->onProcess,
                   UNRECOVERED_JUMPTABLE ==
                   (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
                    *)0x0)) goto LAB_00164351;
                pmVar11 = (pConverter->resampler).pBackend;
                pvVar8 = (pConverter->resampler).pBackendUserData;
                puVar9 = puVar16;
              }
              else {
                if (uVar12 < local_30a0) {
                  local_30a0 = uVar12;
                }
                pmVar2 = (pConverter->resampler).pBackendVTable;
                if ((pmVar2 == (ma_resampling_backend_vtable *)0x0) ||
                   (UNRECOVERED_JUMPTABLE = pmVar2->onProcess,
                   UNRECOVERED_JUMPTABLE ==
                   (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
                    *)0x0)) {
LAB_00164351:
                  mVar5 = MA_NOT_IMPLEMENTED;
                  goto LAB_00164356;
                }
                pmVar11 = (pConverter->resampler).pBackend;
                pvVar8 = (pConverter->resampler).pBackendUserData;
                puVar9 = local_1038;
              }
              mVar5 = (*UNRECOVERED_JUMPTABLE)
                                (pvVar8,pmVar11,local_3038,local_2038,puVar9,&local_30a0);
              pmVar4 = local_3088;
            }
            local_3088 = pmVar4;
            if (mVar5 != MA_SUCCESS) goto LAB_00164356;
            if ((pConverter->hasPostFormatConversion != '\0') && (puVar16 != (undefined1 *)0x0)) {
              ma_pcm_convert(puVar16,pConverter->formatOut,local_1038,(pConverter->resampler).format
                             ,(pConverter->resampler).channels * local_30a0,pConverter->ditherMode);
            }
            mVar18 = mVar18 + local_2038[0];
            mVar19 = mVar19 + local_30a0;
          } while ((local_30a0 != 0) && (mVar19 < local_3098));
        }
        local_3088 = pmVar4;
        mVar5 = MA_SUCCESS;
      }
LAB_00164356:
      if (local_3088 != (ma_uint64 *)0x0) {
        *local_3088 = mVar18;
      }
      if (pFrameCountOut != (ma_uint64 *)0x0) {
        *pFrameCountOut = mVar19;
      }
    }
    break;
  case ma_data_converter_execution_path_resample_first:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      local_3098 = 0;
    }
    else {
      local_3098 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      local_3048 = 0;
    }
    else {
      local_3048 = *pFrameCountOut;
    }
    mVar18 = 0;
    uVar12 = 0x1000 / (ulong)(*(int *)(&DAT_0019a900 + (ulong)(pConverter->resampler).format * 4) *
                             (pConverter->resampler).channels);
    local_3090 = (ma_channel_converter *)
                 (0x1000 / (ulong)(*(int *)(&DAT_0019a900 +
                                           (ulong)(pConverter->channelConverter).format * 4) *
                                  (pConverter->channelConverter).channelsOut));
    if (local_3048 == 0) {
      pmVar15 = (ma_channel_converter *)0x0;
    }
    else {
      local_3058 = &pConverter->channelConverter;
      pmVar15 = (ma_channel_converter *)0x0;
      mVar18 = 0;
      do {
        if (local_3068 == (void *)0x0) {
          puVar16 = (undefined1 *)0x0;
        }
        else {
          puVar16 = (undefined1 *)
                    ((*(int *)(&DAT_0019a900 + (ulong)pConverter->formatIn * 4) *
                     pConverter->channelsIn) * mVar18 + (long)local_3068);
        }
        if (local_3070 == (void *)0x0) {
          puVar10 = (ulong *)0x0;
        }
        else {
          puVar10 = (ulong *)((ulong)(*(int *)(&DAT_0019a900 + (ulong)pConverter->formatOut * 4) *
                                     pConverter->channelsOut) * (long)pmVar15 + (long)local_3070);
        }
        uVar13 = local_3098 - mVar18;
        local_30a0 = uVar12;
        if (uVar13 < uVar12) {
          local_30a0 = uVar13;
        }
        if (pConverter->hasPreFormatConversion == '\0') {
          local_30a0 = uVar13;
        }
        uVar13 = local_3048 - (long)pmVar15;
        if (uVar12 <= local_3048 - (long)pmVar15) {
          uVar13 = uVar12;
        }
        local_3080 = (ma_uint64)local_3090;
        if (uVar13 < local_3090) {
          local_3080 = uVar13;
        }
        if (pConverter->hasPostFormatConversion == '\0') {
          local_3080 = uVar13;
        }
        local_3060 = 0;
        pmVar2 = (pConverter->resampler).pBackendVTable;
        if (((pmVar2 == (ma_resampling_backend_vtable *)0x0) ||
            (p_Var3 = pmVar2->onGetRequiredInputFrameCount,
            p_Var3 == (_func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *)
                      0x0)) ||
           (mVar5 = (*p_Var3)((pConverter->resampler).pBackendUserData,
                              (pConverter->resampler).pBackend,local_3080,&local_3060),
           uVar13 = local_3060, mVar5 != MA_SUCCESS)) {
          uVar13 = ((pConverter->resampler).sampleRateIn * local_3080) /
                   (ulong)(pConverter->resampler).sampleRateOut;
        }
        if (uVar13 < local_30a0) {
          local_30a0 = uVar13;
        }
        bVar20 = pConverter->hasPreFormatConversion == '\0';
        puVar9 = (undefined1 *)0x0;
        if (bVar20) {
          puVar9 = puVar16;
        }
        if (!bVar20 && local_3068 != (void *)0x0) {
          puVar9 = local_1038;
          local_3050 = pmVar15;
          ma_pcm_convert(puVar9,(pConverter->resampler).format,puVar16,pConverter->formatIn,
                         local_30a0 * pConverter->channelsIn,pConverter->ditherMode);
          pmVar15 = local_3050;
        }
        pmVar2 = (pConverter->resampler).pBackendVTable;
        if (pmVar2 == (ma_resampling_backend_vtable *)0x0) {
          return MA_NOT_IMPLEMENTED;
        }
        UNRECOVERED_JUMPTABLE = pmVar2->onProcess;
        if (UNRECOVERED_JUMPTABLE ==
            (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
             *)0x0) {
          return MA_NOT_IMPLEMENTED;
        }
        mVar5 = (*UNRECOVERED_JUMPTABLE)
                          ((pConverter->resampler).pBackendUserData,(pConverter->resampler).pBackend
                           ,puVar9,&local_30a0,local_3038,&local_3080);
        if (mVar5 != MA_SUCCESS) {
          return mVar5;
        }
        if (local_3070 != (void *)0x0) {
          puVar17 = local_2038;
          if (pConverter->hasPostFormatConversion == '\0') {
            puVar17 = puVar10;
          }
          mVar5 = ma_channel_converter_process_pcm_frames(local_3058,puVar17,local_3038,local_3080);
          if (mVar5 != MA_SUCCESS) {
            return mVar5;
          }
          if (pConverter->hasPostFormatConversion != '\0') {
            ma_pcm_convert(puVar10,pConverter->formatOut,puVar17,
                           (pConverter->channelConverter).format,
                           (pConverter->channelConverter).channelsOut * local_3080,
                           pConverter->ditherMode);
          }
        }
        mVar18 = mVar18 + local_30a0;
        pmVar15 = (ma_channel_converter *)((long)pmVar15 + local_3080);
      } while ((local_3080 != 0) && (pmVar15 < local_3048));
    }
    if (local_3088 != (ma_uint64 *)0x0) {
      *local_3088 = mVar18;
    }
    mVar5 = MA_SUCCESS;
    if (local_3078 != (ma_uint64 *)0x0) {
      *local_3078 = (ma_uint64)pmVar15;
    }
    break;
  case ma_data_converter_execution_path_channels_first:
    if (pFrameCountIn == (ma_uint64 *)0x0) {
      local_3098 = 0;
    }
    else {
      local_3098 = *pFrameCountIn;
    }
    if (pFrameCountOut == (ma_uint64 *)0x0) {
      local_3058 = (ma_channel_converter *)0x0;
    }
    else {
      local_3058 = (ma_channel_converter *)*pFrameCountOut;
    }
    mVar18 = 0;
    local_3090 = (ma_channel_converter *)
                 (0x1000 / (ulong)((pConverter->channelConverter).channelsIn *
                                  *(int *)(&DAT_0019a900 +
                                          (ulong)(pConverter->channelConverter).format * 4)));
    uVar12 = 0x1000 / (ulong)(*(int *)(&DAT_0019a900 +
                                      (ulong)(pConverter->channelConverter).format * 4) *
                             (pConverter->channelConverter).channelsOut);
    local_3048 = 0x1000 / (ulong)(*(int *)(&DAT_0019a900 + (ulong)(pConverter->resampler).format * 4
                                          ) * (pConverter->resampler).channels);
    if (local_3058 == (ma_channel_converter *)0x0) {
      uVar13 = 0;
    }
    else {
      local_3050 = &pConverter->channelConverter;
      uVar13 = 0;
      mVar18 = 0;
      local_3040 = uVar12;
      do {
        if (local_3068 == (void *)0x0) {
          puVar16 = (undefined1 *)0x0;
        }
        else {
          puVar16 = (undefined1 *)
                    ((*(int *)(&DAT_0019a900 + (ulong)pConverter->formatIn * 4) *
                     pConverter->channelsIn) * mVar18 + (long)local_3068);
        }
        if (local_3070 == (void *)0x0) {
          puVar10 = (ulong *)0x0;
        }
        else {
          puVar10 = (ulong *)((*(int *)(&DAT_0019a900 + (ulong)pConverter->formatOut * 4) *
                              pConverter->channelsOut) * uVar13 + (long)local_3070);
        }
        uVar6 = (long)local_3058 - uVar13;
        if (uVar12 <= (long)local_3058 - uVar13) {
          uVar6 = uVar12;
        }
        local_3080 = local_3048;
        if (uVar6 < local_3048) {
          local_3080 = uVar6;
        }
        if (pConverter->hasPostFormatConversion == '\0') {
          local_3080 = uVar6;
        }
        uVar6 = local_3098 - mVar18;
        local_30a0 = (ulong)local_3090;
        if (uVar6 < local_3090) {
          local_30a0 = uVar6;
        }
        if (pConverter->hasPreFormatConversion == '\0') {
          local_30a0 = uVar6;
        }
        if (uVar12 <= local_30a0) {
          local_30a0 = uVar12;
        }
        local_3060 = 0;
        pmVar2 = (pConverter->resampler).pBackendVTable;
        if (((pmVar2 == (ma_resampling_backend_vtable *)0x0) ||
            (p_Var3 = pmVar2->onGetRequiredInputFrameCount,
            p_Var3 == (_func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint64_ma_uint64_ptr *)
                      0x0)) ||
           (mVar5 = (*p_Var3)((pConverter->resampler).pBackendUserData,
                              (pConverter->resampler).pBackend,local_3080,&local_3060),
           uVar6 = local_3060, mVar5 != MA_SUCCESS)) {
          uVar6 = ((pConverter->resampler).sampleRateIn * local_3080) /
                  (ulong)(pConverter->resampler).sampleRateOut;
        }
        if (uVar6 < local_30a0) {
          local_30a0 = uVar6;
        }
        puVar9 = puVar16;
        if (pConverter->hasPreFormatConversion != '\0') {
          if (puVar16 == (undefined1 *)0x0) {
            puVar9 = (undefined1 *)0x0;
          }
          else {
            puVar9 = local_1038;
            ma_pcm_convert(puVar9,(pConverter->channelConverter).format,puVar16,pConverter->formatIn
                           ,local_30a0 * pConverter->channelsIn,pConverter->ditherMode);
            uVar12 = local_3040;
          }
        }
        mVar5 = ma_channel_converter_process_pcm_frames(local_3050,local_3038,puVar9,local_30a0);
        if (mVar5 != MA_SUCCESS) {
          return mVar5;
        }
        puVar17 = local_2038;
        if (pConverter->hasPostFormatConversion == '\0') {
          puVar17 = puVar10;
        }
        pmVar2 = (pConverter->resampler).pBackendVTable;
        if (pmVar2 == (ma_resampling_backend_vtable *)0x0) {
          return MA_NOT_IMPLEMENTED;
        }
        UNRECOVERED_JUMPTABLE = pmVar2->onProcess;
        if (UNRECOVERED_JUMPTABLE ==
            (_func_ma_result_void_ptr_ma_resampling_backend_ptr_void_ptr_ma_uint64_ptr_void_ptr_ma_uint64_ptr
             *)0x0) {
          return MA_NOT_IMPLEMENTED;
        }
        mVar5 = (*UNRECOVERED_JUMPTABLE)
                          ((pConverter->resampler).pBackendUserData,(pConverter->resampler).pBackend
                           ,local_3038,&local_30a0,puVar17,&local_3080);
        if (mVar5 != MA_SUCCESS) {
          return mVar5;
        }
        if ((pConverter->hasPostFormatConversion != '\0') && (puVar10 != (ulong *)0x0)) {
          ma_pcm_convert(puVar10,pConverter->formatOut,puVar17,(pConverter->resampler).format,
                         pConverter->channelsOut * local_3080,pConverter->ditherMode);
        }
        mVar18 = mVar18 + local_30a0;
        uVar13 = uVar13 + local_3080;
      } while ((local_3080 != 0) && (uVar13 < local_3058));
    }
    if (local_3088 != (ma_uint64 *)0x0) {
      *local_3088 = mVar18;
    }
    mVar5 = MA_SUCCESS;
    if (local_3078 != (ma_uint64 *)0x0) {
      *local_3078 = uVar13;
    }
    break;
  default:
    mVar5 = MA_INVALID_OPERATION;
  }
  return mVar5;
}

Assistant:

MA_API ma_result ma_data_converter_process_pcm_frames(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    switch (pConverter->executionPath)
    {
        case ma_data_converter_execution_path_passthrough:    return ma_data_converter_process_pcm_frames__passthrough(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_format_only:    return ma_data_converter_process_pcm_frames__format_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_channels_only:  return ma_data_converter_process_pcm_frames__channels_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_resample_only:  return ma_data_converter_process_pcm_frames__resample_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_resample_first: return ma_data_converter_process_pcm_frames__resample_first(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_channels_first: return ma_data_converter_process_pcm_frames__channels_first(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        default: return MA_INVALID_OPERATION;   /* Should never hit this. */
    }
}